

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *__x;
  pointer pVVar1;
  pointer pbVar2;
  const_iterator __position;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t amount;
  Value *child_2;
  pointer pVVar6;
  bool bVar7;
  pointer pVVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar10;
  pointer pbVar11;
  Value *child_1;
  ulong uVar12;
  ulong uVar13;
  string_view first_indent;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range3;
  string s_1;
  undefined1 local_a8 [40];
  char *local_80;
  ulong local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_80 = prefix._M_str;
  sVar3 = prefix._M_len;
  pVVar6 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar6 == pVVar1) {
    uVar12 = 0;
    bVar7 = false;
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    bVar7 = false;
    uVar12 = 0;
    pVVar8 = pVVar6;
    do {
      pbVar2 = (pVVar8->v).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar13 = 0;
      pbVar11 = (pVVar8->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar10 = pbVar11; pbVar10 != pbVar2; pbVar10 = pbVar10 + 1) {
        if (uVar13 <= pbVar10->_M_string_length) {
          uVar13 = pbVar10->_M_string_length;
        }
      }
      if (uVar12 <= uVar13) {
        uVar12 = uVar13;
      }
      lVar5 = lVar5 + uVar13;
      bVar7 = (bool)(bVar7 | 0x20U < (ulong)((long)pbVar2 - (long)pbVar11));
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != pVVar1);
  }
  if ((bVar7) || (this->target_exp_width <= lVar5 + sVar3 + postfix._M_len && pVVar6 != pVVar1)) {
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
    __return_storage_ptr__->precedence = precedence;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
    uVar12 = uVar12 + sVar3;
    local_78 = this->target_exp_width;
    pVVar6 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_70 = (args->
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar6 != local_70) {
      uVar13 = 0;
      do {
        amount = sVar3;
        if (local_78 <= uVar12) {
          amount = this->indent_amount;
        }
        pcVar9 = local_80;
        sVar4 = sVar3;
        if (uVar13 != 0 || local_78 <= uVar12) {
          sVar4 = 0;
          pcVar9 = (char *)0x0;
        }
        first_indent._M_str = pcVar9;
        first_indent._M_len = sVar4;
        IndentValue(this,pVVar6,amount,first_indent);
        if (uVar13 < ((long)(args->
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__cxx11::string::append
                    ((char *)((pVVar6->v).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        pbVar11 = (pVVar6->v).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(pVVar6->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5;
        if (0 < lVar5) {
          lVar5 = lVar5 + 1;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,pbVar11);
            pbVar11 = pbVar11 + 1;
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
        }
        uVar13 = uVar13 + 1;
        pVVar6 = pVVar6 + 1;
      } while (pVVar6 != local_70);
    }
    if (local_78 <= uVar12) {
      __position._M_current =
           (__return_storage_ptr__->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8._0_8_ = (pointer)(local_a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_80,local_80 + sVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&__return_storage_ptr__->v,__position,(value_type *)local_a8);
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append
              ((char *)((__return_storage_ptr__->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)postfix._M_str);
  }
  else {
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_80,local_80 + sVar3);
    pVVar6 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar1 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pVVar6 != pVVar1) {
      do {
        if (pVVar6 != (args->
                      super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::append(local_a8);
        }
        std::__cxx11::string::_M_append
                  (local_a8,(ulong)(((pVVar6->v).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        pVVar6 = pVVar6 + 1;
      } while (pVVar6 != pVVar1);
    }
    std::__cxx11::string::append(local_a8,(ulong)postfix._M_str);
    pbVar11 = (pointer)(local_a8 + 0x10);
    if ((pointer)local_a8._0_8_ == pbVar11) {
      local_58._8_8_ = local_a8._24_8_;
      local_68 = (pointer)local_58;
    }
    else {
      local_68 = (pointer)local_a8._0_8_;
    }
    local_58._0_8_ = local_a8._16_8_;
    local_60 = (pointer)local_a8._8_8_;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
    __x = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_58 + 0x10);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    local_a8._0_8_ = pbVar11;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>(__x,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__x);
    __return_storage_ptr__->precedence = precedence;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__x);
    if (local_68 != (pointer)local_58) {
      operator_delete(local_68,(ulong)((long)&((_Alloc_hider *)local_58._0_8_)->_M_p + 1));
    }
    if ((pointer)local_a8._0_8_ != pbVar11) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args,
                 std::string_view prefix,
                 std::string_view postfix,
                 Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml{{}, precedence};
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : std::string_view{});
        if (i < args.size() - 1) {
          child.v.back() += ",";
        }
        std::move(child.v.begin(), child.v.end(), std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) {
        ml.v.insert(ml.v.begin(), std::string(prefix));
      }
      ml.v.back() += postfix;
      return ml;
    }
  }